

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void SeedRandomStateForTest(SeedRand seedtype)

{
  int iVar1;
  uint256 *puVar2;
  anon_class_1_0_00000001 *in_RSI;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *RANDOM_CTX_SEED;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  RANDOM_CTX_SEED = "RANDOM_CTX_SEED";
  if (SeedRandomStateForTest(SeedRand)::ctx_seed == '\0') {
    puVar2 = (uint256 *)&SeedRandomStateForTest(SeedRand)::ctx_seed;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      SeedRandomStateForTest::anon_class_1_0_00000001::operator()(puVar2,in_RSI);
      __cxa_guard_release(&SeedRandomStateForTest(SeedRand)::ctx_seed);
    }
  }
  if (seedtype == FIXED_SEED) {
    puVar2 = &SeedRandomStateForTest::ctx_seed;
  }
  else {
    puVar2 = &uint256::ZERO;
  }
  base_blob<256u>::GetHex_abi_cxx11_(&local_38,puVar2);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/random.cpp"
  ;
  source_file._M_len = 100;
  logging_function._M_str = "SeedRandomStateForTest";
  logging_function._M_len = 0x16;
  LogPrintFormatInternal<char_const*,std::__cxx11::string>
            (logging_function,source_file,0x28,ALL,Info,(ConstevalFormatString<2U>)0xf69c3a,
             &RANDOM_CTX_SEED,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  MakeRandDeterministicDANGEROUS(puVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedRandomStateForTest(SeedRand seedtype)
{
    constexpr auto RANDOM_CTX_SEED{"RANDOM_CTX_SEED"};

    // Do this once, on the first call, regardless of seedtype, because once
    // MakeRandDeterministicDANGEROUS is called, the output of GetRandHash is
    // no longer truly random. It should be enough to get the seed once for the
    // process.
    static const uint256 ctx_seed = []() {
        // If RANDOM_CTX_SEED is set, use that as seed.
        if (const char* num{std::getenv(RANDOM_CTX_SEED)}) {
            if (auto num_parsed{uint256::FromUserHex(num)}) {
                return *num_parsed;
            } else {
                std::cerr << RANDOM_CTX_SEED << " must consist of up to " << uint256::size() * 2 << " hex digits (\"0x\" prefix allowed), it was set to: '" << num << "'.\n";
                std::abort();
            }
        }
        // Otherwise use a (truly) random value.
        return GetRandHash();
    }();

    const uint256& seed{seedtype == SeedRand::FIXED_SEED ? ctx_seed : uint256::ZERO};
    LogInfo("Setting random seed for current tests to %s=%s\n", RANDOM_CTX_SEED, seed.GetHex());
    MakeRandDeterministicDANGEROUS(seed);
}